

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  U32 *pUVar4;
  ulong srcSize;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  U32 *headerBuffer;
  size_t sVar9;
  bool bVar10;
  uint matchlengthMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_10c;
  uint local_108;
  uint local_104;
  size_t local_100;
  ZSTD_matchState_t *local_f8;
  ZSTD_CCtx_params *local_f0;
  U32 local_e8 [28];
  short local_78 [36];
  
  if (dictSize < 9 || dict == (void *)0x0) {
    return 0;
  }
  bs->rep[0] = 1;
  bs->rep[1] = 4;
  bs->rep[2] = 8;
  (bs->entropy).hufCTable_repeatMode = HUF_repeat_none;
  (bs->entropy).offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).litlength_repeatMode = FSE_repeat_none;
  if (dictContentType == ZSTD_dct_rawContent) {
LAB_00157ef3:
    ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
    return 0;
  }
  if (*dict != -0x13cf5bc9) {
    if (dictContentType == ZSTD_dct_fullDict) {
      return 0xffffffffffffffe0;
    }
    if (dictContentType == ZSTD_dct_auto) goto LAB_00157ef3;
  }
  local_108 = 0x1f;
  if ((params->fParams).noDictIDFlag == 0) {
    local_100 = (size_t)*(uint *)((long)dict + 4);
  }
  else {
    local_100 = 0;
  }
  local_e8[0] = 0xff;
  local_f8 = ms;
  local_f0 = params;
  sVar2 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8);
  uVar1 = HUF_isError(sVar2);
  if (local_e8[0] < 0xff || uVar1 != 0) {
    return 0xffffffffffffffe2;
  }
  pUVar4 = (U32 *)(dictSize + (long)dict);
  headerBuffer = (U32 *)((long)dict + sVar2 + 8);
  sVar2 = FSE_readNCount(local_78,&local_108,local_e8,headerBuffer,(long)pUVar4 - (long)headerBuffer
                        );
  uVar1 = FSE_isError(sVar2);
  if ((uVar1 == 0) && (local_e8[0] < 9)) {
    sVar8 = FSE_buildCTable_wksp
                      ((bs->entropy).offcodeCTable,local_78,0x1f,local_e8[0],workspace,0x1800);
    bVar10 = sVar8 < 0xffffffffffffff89;
    sVar8 = 0;
    if (bVar10) {
      sVar8 = sVar2;
    }
    headerBuffer = (U32 *)((long)headerBuffer + sVar8);
  }
  else {
    bVar10 = false;
  }
  if (!bVar10) {
    return 0xffffffffffffffe2;
  }
  local_10c = 0x34;
  sVar2 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar4 - (long)headerBuffer);
  uVar1 = FSE_isError(sVar2);
  if (local_104 < 10 && uVar1 == 0) {
    if (local_10c < 0x34) {
      bVar10 = false;
LAB_00158081:
      sVar8 = 0xffffffffffffffe2;
    }
    else {
      sVar8 = 0;
      lVar5 = 0;
      do {
        bVar10 = local_78[lVar5 + -0x38] != 0;
        if (local_78[lVar5 + -0x38] == 0) goto LAB_00158081;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x35);
      bVar10 = true;
    }
    if (!bVar10) goto LAB_0015811d;
    sVar8 = FSE_buildCTable_wksp
                      ((bs->entropy).matchlengthCTable,(short *)local_e8,local_10c,local_104,
                       workspace,0x1800);
    sVar9 = 0;
    bVar10 = sVar8 < 0xffffffffffffff89;
    if (bVar10) {
      sVar9 = sVar2;
    }
    sVar8 = 0xffffffffffffffe2;
    headerBuffer = (U32 *)((long)headerBuffer + sVar9);
  }
  else {
    sVar8 = 0xffffffffffffffe2;
LAB_0015811d:
    bVar10 = false;
  }
  if (!bVar10) {
    return sVar8;
  }
  local_10c = 0x23;
  sVar2 = FSE_readNCount((short *)local_e8,&local_10c,&local_104,headerBuffer,
                         (long)pUVar4 - (long)headerBuffer);
  uVar1 = FSE_isError(sVar2);
  if (local_104 < 10 && uVar1 == 0) {
    sVar9 = 0xffffffffffffffe2;
    if (local_10c < 0x23) {
      bVar10 = false;
    }
    else {
      lVar5 = 0;
      do {
        bVar10 = local_78[lVar5 + -0x38] != 0;
        if (local_78[lVar5 + -0x38] == 0) goto LAB_001581a2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x24);
      bVar10 = true;
      sVar9 = 0;
    }
LAB_001581a2:
    if (bVar10) {
      sVar9 = FSE_buildCTable_wksp
                        ((bs->entropy).litlengthCTable,(short *)local_e8,local_10c,local_104,
                         workspace,0x1800);
      bVar10 = sVar9 < 0xffffffffffffff89;
      sVar9 = sVar8;
      if (!bVar10) {
        sVar2 = 0;
        sVar9 = 0xffffffffffffffe2;
      }
      headerBuffer = (U32 *)((long)headerBuffer + sVar2);
      goto LAB_001581e9;
    }
  }
  else {
    sVar9 = 0xffffffffffffffe2;
  }
  bVar10 = false;
LAB_001581e9:
  if (!bVar10) {
    return sVar9;
  }
  src = headerBuffer + 3;
  sVar2 = 0xffffffffffffffe2;
  if (pUVar4 < src) {
    return 0xffffffffffffffe2;
  }
  bs->rep[0] = *headerBuffer;
  bs->rep[1] = headerBuffer[1];
  srcSize = (long)pUVar4 - (long)src;
  uVar3 = (int)srcSize + 0x20000;
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar3 = 0x1f;
  if (srcSize >> 0x11 < 0x7fff) {
    uVar3 = uVar1;
  }
  bs->rep[2] = headerBuffer[2];
  if (local_108 < uVar3) {
    bVar10 = false;
  }
  else {
    uVar6 = 0;
    do {
      bVar10 = local_78[uVar6] != 0;
      if (local_78[uVar6] == 0) goto LAB_00158276;
      uVar6 = uVar6 + 1;
    } while (uVar3 + 1 != uVar6);
    bVar10 = true;
    sVar2 = 0;
  }
LAB_00158276:
  if (!bVar10) {
    return sVar2;
  }
  sVar8 = 0xffffffffffffffe2;
  sVar2 = sVar8;
  bVar10 = false;
  if (((ulong)bs->rep[0] != 0) && (bVar10 = false, bs->rep[0] <= srcSize)) {
    uVar6 = 0;
    do {
      uVar7 = uVar6;
      sVar2 = sVar9;
      if ((uVar7 == 2) || (sVar2 = sVar8, (ulong)bs->rep[uVar7 + 1] == 0)) break;
      uVar6 = uVar7 + 1;
    } while (bs->rep[uVar7 + 1] <= srcSize);
    bVar10 = 1 < uVar7;
  }
  if (!bVar10) {
    return sVar2;
  }
  (bs->entropy).hufCTable_repeatMode = HUF_repeat_valid;
  (bs->entropy).offcode_repeatMode = FSE_repeat_valid;
  (bs->entropy).matchlength_repeatMode = FSE_repeat_valid;
  (bs->entropy).litlength_repeatMode = FSE_repeat_valid;
  ZSTD_loadDictionaryContent(local_f8,local_f0,src,srcSize,dtlm);
  return local_100;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}